

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void testutil_random_fe_non_zero_test(secp256k1_fe *fe)

{
  secp256k1_fe *r;
  uint64_t *puVar1;
  int *piVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_EAX;
  uint32_t uVar10;
  secp256k1_gej *psVar11;
  long lVar12;
  secp256k1_gej *in_RCX;
  uint count;
  uint uVar13;
  secp256k1_gej *a;
  secp256k1_gej *extraout_RDX;
  ulong uVar14;
  uint64_t *t;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *in_RSI;
  secp256k1_gej *a_00;
  secp256k1_ge *psVar18;
  ulong uVar19;
  secp256k1_ge *a_01;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar20;
  secp256k1_gej *psVar21;
  ulong uVar22;
  secp256k1_ge *psVar23;
  ulong uVar24;
  secp256k1_ge *r_00;
  ulong uVar25;
  secp256k1_gej *unaff_R12;
  secp256k1_fe *psVar26;
  secp256k1_gej *unaff_R13;
  uint uVar27;
  secp256k1_fe *psVar28;
  bool bVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  undefined1 auStack_7f0 [56];
  ulong uStack_7b8;
  ulong uStack_7b0;
  ulong uStack_7a8;
  ulong uStack_7a0;
  ulong uStack_798;
  secp256k1_ge sStack_790;
  secp256k1_ge *psStack_728;
  undefined1 auStack_720 [56];
  uint64_t uStack_6e8;
  uint64_t uStack_6e0;
  uint64_t uStack_6d8;
  uint64_t uStack_6d0;
  int iStack_6c8;
  secp256k1_ge sStack_6b0;
  secp256k1_ge sStack_640;
  secp256k1_gej sStack_5d0;
  secp256k1_fe *psStack_538;
  secp256k1_ge *psStack_530;
  secp256k1_fe *psStack_528;
  secp256k1_ge *psStack_520;
  secp256k1_fe *psStack_518;
  secp256k1_ge *psStack_510;
  undefined1 auStack_500 [92];
  int iStack_4a4;
  secp256k1_ge sStack_4a0;
  secp256k1_fe sStack_438;
  secp256k1_fe sStack_408;
  secp256k1_gej *psStack_3d0;
  secp256k1_gej *psStack_3c8;
  secp256k1_fe *psStack_3c0;
  undefined1 *puStack_3b8;
  secp256k1_fe *psStack_3b0;
  secp256k1_fe *psStack_3a8;
  secp256k1_gej sStack_3a0;
  int *piStack_300;
  secp256k1_gej *psStack_2f8;
  secp256k1_gej *psStack_2f0;
  secp256k1_gej *psStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  undefined1 auStack_2d0 [88];
  undefined8 uStack_278;
  secp256k1_gej *psStack_268;
  secp256k1_fe *psStack_260;
  secp256k1_fe *psStack_258;
  undefined1 auStack_250 [56];
  uint64_t uStack_218;
  uint64_t uStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  int iStack_1f8;
  undefined1 auStack_1f0 [56];
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  ulong uStack_1a0;
  ulong uStack_198;
  undefined1 auStack_190 [56];
  uint64_t uStack_158;
  uint64_t uStack_150;
  uint64_t uStack_148;
  uint64_t uStack_140;
  int iStack_138;
  secp256k1_fe sStack_130;
  secp256k1_fe sStack_100;
  secp256k1_fe sStack_d0;
  secp256k1_fe sStack_a0;
  uint64_t uStack_70;
  uint64_t uStack_68;
  uint64_t uStack_60;
  uint64_t uStack_58;
  uint64_t uStack_50;
  int iStack_48;
  int iStack_44;
  secp256k1_fe *psStack_38;
  
  bVar30 = 0;
  while( true ) {
    testutil_random_fe_test(fe);
    psVar11 = (secp256k1_gej *)fe;
    secp256k1_fe_verify(fe);
    if (fe->normalized == 0) break;
    if (((fe->n[3] != 0 || fe->n[1] != 0) || (fe->n[2] != 0 || fe->n[0] != 0)) || fe->n[4] != 0) {
      return;
    }
  }
  testutil_random_fe_non_zero_test_cold_1();
  uStack_278._0_4_ = 0x14d039;
  uStack_278._4_4_ = 0;
  a_00 = in_RSI;
  psStack_38 = fe;
  secp256k1_gej_verify(in_RSI);
  uStack_278._0_4_ = 0x14d041;
  uStack_278._4_4_ = 0;
  a_02 = a;
  secp256k1_gej_verify(a);
  if (in_RSI->infinity == 0) {
    if (a->infinity != 0) {
      psVar17 = in_RSI;
      if (in_RCX != (secp256k1_gej *)0x0) {
        (in_RCX->x).n[0] = 1;
        (in_RCX->x).n[1] = 0;
        (in_RCX->x).n[2] = 0;
        (in_RCX->x).n[3] = 0;
        (in_RCX->x).n[4] = 0;
        (in_RCX->x).magnitude = 1;
        (in_RCX->x).normalized = 1;
        uStack_278._0_4_ = 0x14d099;
        uStack_278._4_4_ = 0;
        secp256k1_fe_verify(&in_RCX->x);
      }
      goto LAB_0014d0a4;
    }
    psVar26 = &a->z;
    uStack_278._0_4_ = 0x14d0d3;
    uStack_278._4_4_ = 0;
    psStack_268 = in_RCX;
    secp256k1_fe_sqr(&sStack_100,psVar26);
    unaff_R13 = (secp256k1_gej *)&in_RSI->z;
    uStack_278._0_4_ = 0x14d0ea;
    uStack_278._4_4_ = 0;
    secp256k1_fe_sqr(&sStack_a0,(secp256k1_fe *)unaff_R13);
    uStack_278._0_4_ = 0x14d102;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul(&sStack_130,&in_RSI->x,&sStack_100);
    uStack_278._0_4_ = 0x14d115;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_190 + 0x30),&a->x,&sStack_a0);
    uStack_278._0_4_ = 0x14d131;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)auStack_190,&in_RSI->y,&sStack_100);
    uStack_278._0_4_ = 0x14d144;
    uStack_278._4_4_ = 0;
    psStack_260 = psVar26;
    secp256k1_fe_mul((secp256k1_fe *)auStack_190,(secp256k1_fe *)auStack_190,psVar26);
    psVar17 = (secp256k1_gej *)0x3fffffffffffc;
    uStack_278._0_4_ = 0x14d16d;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul(&sStack_d0,&a->y,&sStack_a0);
    uStack_278._0_4_ = 0x14d180;
    uStack_278._4_4_ = 0;
    psStack_258 = (secp256k1_fe *)unaff_R13;
    secp256k1_fe_mul(&sStack_d0,&sStack_d0,(secp256k1_fe *)unaff_R13);
    uStack_278._0_4_ = 0x14d190;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&sStack_130);
    a_00 = (secp256k1_gej *)0x1;
    uStack_278._0_4_ = 0x14d19d;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&sStack_130,1);
    auStack_1f0._48_8_ = 0x3ffffbfffff0bc - sStack_130.n[0];
    uStack_1b8 = 0x3ffffffffffffc - sStack_130.n[1];
    unaff_R12 = (secp256k1_gej *)(auStack_1f0 + 0x30);
    uStack_1b0 = 0x3ffffffffffffc - sStack_130.n[2];
    uStack_1a8 = 0x3ffffffffffffc - sStack_130.n[3];
    uStack_1a0 = 0x3fffffffffffc - sStack_130.n[4];
    uStack_198 = 2;
    uStack_278._0_4_ = 0x14d1ea;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    uStack_278._0_4_ = 0x14d1f2;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    in_RCX = (secp256k1_gej *)(auStack_190 + 0x30);
    uStack_278._0_4_ = 0x14d202;
    uStack_278._4_4_ = 0;
    a_02 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    if (0x20 < iStack_138 + (int)uStack_198) goto LAB_0014d842;
    auStack_1f0._48_8_ = auStack_1f0._48_8_ + auStack_190._48_8_;
    uStack_1b8 = uStack_1b8 + uStack_158;
    uStack_1b0 = uStack_1b0 + uStack_150;
    uStack_1a8 = uStack_1a8 + uStack_148;
    uStack_1a0 = uStack_1a0 + uStack_140;
    uStack_198 = (ulong)(uint)(iStack_138 + (int)uStack_198);
    uStack_278._0_4_ = 0x14d25b;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1f0 + 0x30));
    uStack_278._0_4_ = 0x14d26b;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&sStack_d0);
    a_00 = (secp256k1_gej *)0x1;
    uStack_278._0_4_ = 0x14d278;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&sStack_d0,1);
    auStack_1f0._0_8_ = 0x3ffffbfffff0bc - sStack_d0.n[0];
    auStack_1f0._8_8_ = 0x3ffffffffffffc - sStack_d0.n[1];
    unaff_R13 = (secp256k1_gej *)auStack_1f0;
    auStack_1f0._16_8_ = 0x3ffffffffffffc - sStack_d0.n[2];
    auStack_1f0._24_8_ = 0x3ffffffffffffc - sStack_d0.n[3];
    auStack_1f0._32_8_ = 0x3fffffffffffc - sStack_d0.n[4];
    auStack_1f0._40_8_ = 2;
    uStack_278._0_4_ = 0x14d2c5;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    uStack_278._0_4_ = 0x14d2cd;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    unaff_R12 = (secp256k1_gej *)auStack_190;
    uStack_278._0_4_ = 0x14d2dd;
    uStack_278._4_4_ = 0;
    a_02 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x20 < (int)(auStack_190._40_4_ + auStack_1f0._40_4_)) goto LAB_0014d847;
    auStack_1f0._0_8_ = auStack_1f0._0_8_ + auStack_190._0_8_;
    auStack_1f0._8_8_ = auStack_1f0._8_8_ + auStack_190._8_8_;
    auStack_1f0._16_8_ = auStack_1f0._16_8_ + auStack_190._16_8_;
    auStack_1f0._24_8_ = auStack_1f0._24_8_ + auStack_190._24_8_;
    auStack_1f0._32_8_ = auStack_1f0._32_8_ + auStack_190._32_8_;
    auStack_1f0._44_4_ = 0;
    auStack_1f0._40_4_ = auStack_190._40_4_ + auStack_1f0._40_4_;
    uStack_278._0_4_ = 0x14d34a;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1f0);
    uStack_278._0_4_ = 0x14d35a;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1f0 + 0x30));
    psVar17 = (secp256k1_gej *)0x1000003d1;
    uVar22 = (uStack_1a0 >> 0x30) * 0x1000003d1 + auStack_1f0._48_8_;
    if (((uVar22 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar22 & 0xfffffffffffff) == 0)) {
      uVar14 = (uVar22 >> 0x34) + uStack_1b8;
      uVar19 = (uVar14 >> 0x34) + uStack_1b0;
      uVar24 = (uVar19 >> 0x34) + uStack_1a8;
      uVar25 = (uVar24 >> 0x34) + (uStack_1a0 & 0xffffffffffff);
      if ((((uVar14 | uVar22 | uVar19 | uVar24) & 0xfffffffffffff) == 0 && uVar25 == 0) ||
         (((uVar22 | 0x1000003d0) & uVar14 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        uStack_278._0_4_ = 0x14d73e;
        uStack_278._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_1f0);
        uVar22 = ((ulong)auStack_1f0._32_8_ >> 0x30) * 0x1000003d1 + auStack_1f0._0_8_;
        if (((uVar22 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar22 & 0xfffffffffffff) == 0)) {
          uVar14 = (uVar22 >> 0x34) + auStack_1f0._8_8_;
          uVar19 = (uVar14 >> 0x34) + auStack_1f0._16_8_;
          uVar24 = (uVar19 >> 0x34) + auStack_1f0._24_8_;
          uVar25 = (uVar24 >> 0x34) + (auStack_1f0._32_8_ & 0xffffffffffff);
          if ((((uVar14 | uVar22 | uVar19 | uVar24) & 0xfffffffffffff) == 0 && uVar25 == 0) ||
             (((uVar22 | 0x1000003d0) & uVar14 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            uStack_278._0_4_ = 0x14d82b;
            uStack_278._4_4_ = 0;
            secp256k1_gej_double_var(psVar11,in_RSI,&psStack_268->x);
            return;
          }
        }
        if (psStack_268 != (secp256k1_gej *)0x0) {
          *(undefined1 (*) [16])((long)(psStack_268->x).n + 0x1c) = (undefined1  [16])0x0;
          (psStack_268->x).n[2] = 0;
          (psStack_268->x).n[3] = 0;
          (psStack_268->x).n[0] = 0;
          (psStack_268->x).n[1] = 0;
          (psStack_268->x).normalized = 1;
          uStack_278._0_4_ = 0x14d811;
          uStack_278._4_4_ = 0;
          secp256k1_fe_verify(&psStack_268->x);
        }
        uStack_278._0_4_ = 0x14d819;
        uStack_278._4_4_ = 0;
        secp256k1_gej_set_infinity(psVar11);
        return;
      }
    }
    psVar11->infinity = 0;
    uStack_278._0_4_ = 0x14d435;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)auStack_250,(secp256k1_fe *)(auStack_1f0 + 0x30),psStack_260);
    if (psStack_268 != (secp256k1_gej *)0x0) {
      (psStack_268->x).n[4] = auStack_250._32_8_;
      (psStack_268->x).magnitude = auStack_250._40_4_;
      (psStack_268->x).normalized = auStack_250._44_4_;
      (psStack_268->x).n[2] = auStack_250._16_8_;
      (psStack_268->x).n[3] = auStack_250._24_8_;
      (psStack_268->x).n[0] = auStack_250._0_8_;
      (psStack_268->x).n[1] = auStack_250._8_8_;
    }
    in_RCX = (secp256k1_gej *)auStack_250;
    uStack_278._0_4_ = 0x14d473;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul(&psVar11->z,psStack_258,(secp256k1_fe *)in_RCX);
    in_RSI = (secp256k1_gej *)&stack0xffffffffffffff90;
    unaff_R12 = (secp256k1_gej *)(auStack_1f0 + 0x30);
    uStack_278._0_4_ = 0x14d48e;
    uStack_278._4_4_ = 0;
    secp256k1_fe_sqr((secp256k1_fe *)in_RSI,(secp256k1_fe *)unaff_R12);
    uStack_278._0_4_ = 0x14d496;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    uStack_278._0_4_ = 0x14d4a3;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)in_RSI,1);
    uStack_70 = 0x3ffffbfffff0bc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    uStack_58 = 0x3ffffffffffffc - uStack_58;
    uStack_50 = 0x3fffffffffffc - uStack_50;
    iStack_48 = 2;
    iStack_44 = 0;
    uStack_278._0_4_ = 0x14d4eb;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    unaff_R13 = (secp256k1_gej *)(auStack_250 + 0x30);
    uStack_278._0_4_ = 0x14d4fe;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R13,(secp256k1_fe *)in_RSI,(secp256k1_fe *)unaff_R12);
    uStack_278._0_4_ = 0x14d511;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)in_RCX,&sStack_130,(secp256k1_fe *)in_RSI);
    a_00 = (secp256k1_gej *)auStack_1f0;
    uStack_278._0_4_ = 0x14d521;
    uStack_278._4_4_ = 0;
    secp256k1_fe_sqr(&psVar11->x,(secp256k1_fe *)a_00);
    uStack_278._0_4_ = 0x14d529;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    uStack_278._0_4_ = 0x14d531;
    uStack_278._4_4_ = 0;
    a_02 = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    iVar8 = iStack_1f8 + (psVar11->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d84c;
    uVar7 = (psVar11->x).n[1];
    uVar4 = (psVar11->x).n[2];
    uVar5 = (psVar11->x).n[3];
    (psVar11->x).n[0] = (psVar11->x).n[0] + auStack_250._48_8_;
    (psVar11->x).n[1] = uVar7 + uStack_218;
    (psVar11->x).n[2] = uVar4 + uStack_210;
    (psVar11->x).n[3] = uVar5 + uStack_208;
    puVar1 = (psVar11->x).n + 4;
    *puVar1 = *puVar1 + uStack_200;
    (psVar11->x).magnitude = iVar8;
    (psVar11->x).normalized = 0;
    uStack_278._0_4_ = 0x14d57a;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    uStack_278._0_4_ = 0x14d582;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    in_RCX = (secp256k1_gej *)auStack_250;
    uStack_278._0_4_ = 0x14d58f;
    uStack_278._4_4_ = 0;
    a_02 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    iVar8 = auStack_250._40_4_ + (psVar11->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d851;
    uVar7 = (psVar11->x).n[1];
    uVar4 = (psVar11->x).n[2];
    uVar5 = (psVar11->x).n[3];
    in_RCX = (secp256k1_gej *)auStack_250;
    (psVar11->x).n[0] = (psVar11->x).n[0] + auStack_250._0_8_;
    (psVar11->x).n[1] = uVar7 + auStack_250._8_8_;
    (psVar11->x).n[2] = uVar4 + auStack_250._16_8_;
    (psVar11->x).n[3] = uVar5 + auStack_250._24_8_;
    puVar1 = (psVar11->x).n + 4;
    *puVar1 = *puVar1 + auStack_250._32_8_;
    (psVar11->x).magnitude = iVar8;
    (psVar11->x).normalized = 0;
    uStack_278._0_4_ = 0x14d5db;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    uStack_278._0_4_ = 0x14d5e3;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    uStack_278._0_4_ = 0x14d5eb;
    uStack_278._4_4_ = 0;
    a_02 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    iVar8 = auStack_250._40_4_ + (psVar11->x).magnitude;
    if (0x20 < iVar8) goto LAB_0014d856;
    uVar7 = (psVar11->x).n[1];
    uVar4 = (psVar11->x).n[2];
    uVar5 = (psVar11->x).n[3];
    in_RCX = (secp256k1_gej *)auStack_250;
    (psVar11->x).n[0] = (psVar11->x).n[0] + auStack_250._0_8_;
    (psVar11->x).n[1] = uVar7 + auStack_250._8_8_;
    (psVar11->x).n[2] = uVar4 + auStack_250._16_8_;
    (psVar11->x).n[3] = uVar5 + auStack_250._24_8_;
    puVar1 = (psVar11->x).n + 4;
    *puVar1 = *puVar1 + auStack_250._32_8_;
    (psVar11->x).magnitude = iVar8;
    (psVar11->x).normalized = 0;
    uStack_278._0_4_ = 0x14d637;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify(&psVar11->x);
    uStack_278._0_4_ = 0x14d63f;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    uStack_278._0_4_ = 0x14d647;
    uStack_278._4_4_ = 0;
    a_02 = psVar11;
    secp256k1_fe_verify(&psVar11->x);
    iVar8 = (psVar11->x).magnitude + auStack_250._40_4_;
    if (0x20 < iVar8) goto LAB_0014d85b;
    auStack_250._0_8_ = (psVar11->x).n[0] + auStack_250._0_8_;
    auStack_250._8_8_ = (psVar11->x).n[1] + auStack_250._8_8_;
    auStack_250._16_8_ = (psVar11->x).n[2] + auStack_250._16_8_;
    auStack_250._24_8_ = (psVar11->x).n[3] + auStack_250._24_8_;
    auStack_250._32_8_ = auStack_250._32_8_ + (psVar11->x).n[4];
    auStack_250._44_4_ = 0;
    uStack_278._0_4_ = 0x14d697;
    uStack_278._4_4_ = 0;
    auStack_250._40_4_ = iVar8;
    secp256k1_fe_verify((secp256k1_fe *)auStack_250);
    in_RCX = (secp256k1_gej *)&psVar11->y;
    uStack_278._0_4_ = 0x14d6ae;
    uStack_278._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)in_RCX,(secp256k1_fe *)auStack_250,(secp256k1_fe *)auStack_1f0)
    ;
    in_RSI = (secp256k1_gej *)(auStack_250 + 0x30);
    uStack_278._0_4_ = 0x14d6c6;
    uStack_278._4_4_ = 0;
    a_00 = in_RSI;
    secp256k1_fe_mul((secp256k1_fe *)in_RSI,(secp256k1_fe *)in_RSI,(secp256k1_fe *)auStack_190);
    uStack_278._0_4_ = 0x14d6ce;
    uStack_278._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    uStack_278._0_4_ = 0x14d6d6;
    uStack_278._4_4_ = 0;
    a_02 = in_RSI;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    iStack_1f8 = iStack_1f8 + (psVar11->y).magnitude;
    if (iStack_1f8 < 0x21) {
      uVar7 = (psVar11->y).n[1];
      uVar4 = (psVar11->y).n[2];
      uVar5 = (psVar11->y).n[3];
      (psVar11->y).n[0] = (psVar11->y).n[0] + auStack_250._48_8_;
      (psVar11->y).n[1] = uVar7 + uStack_218;
      (psVar11->y).n[2] = uVar4 + uStack_210;
      (psVar11->y).n[3] = uVar5 + uStack_208;
      puVar1 = (psVar11->y).n + 4;
      *puVar1 = *puVar1 + uStack_200;
      (psVar11->y).magnitude = iStack_1f8;
      (psVar11->y).normalized = 0;
      uStack_278._0_4_ = 0x14d721;
      uStack_278._4_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)in_RCX);
      uStack_278._0_4_ = 0x14d729;
      uStack_278._4_4_ = 0;
      secp256k1_gej_verify(psVar11);
      return;
    }
  }
  else {
    psVar17 = a;
    if (in_RCX == (secp256k1_gej *)0x0) {
LAB_0014d0a4:
      memcpy(psVar11,psVar17,0x98);
      return;
    }
    uStack_278._0_4_ = 0x14d842;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_1();
LAB_0014d842:
    uStack_278._0_4_ = 0x14d847;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_8();
LAB_0014d847:
    uStack_278._0_4_ = 0x14d84c;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_7();
LAB_0014d84c:
    uStack_278._0_4_ = 0x14d851;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_6();
LAB_0014d851:
    uStack_278._0_4_ = 0x14d856;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_5();
LAB_0014d856:
    uStack_278._0_4_ = 0x14d85b;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_4();
LAB_0014d85b:
    uStack_278._0_4_ = 0x14d860;
    uStack_278._4_4_ = 0;
    secp256k1_gej_add_var_cold_3();
  }
  uStack_278 = secp256k1_ge_set_all_gej_var;
  secp256k1_gej_add_var_cold_2();
  psVar15 = a_00;
  psVar20 = extraout_RDX;
  psStack_2d8 = extraout_RDX;
  auStack_2d0._48_8_ = psVar11;
  auStack_2d0._56_8_ = unaff_R12;
  auStack_2d0._64_8_ = unaff_R13;
  auStack_2d0._72_8_ = in_RCX;
  auStack_2d0._80_8_ = in_RSI;
  uStack_278 = (code *)psVar17;
  if (extraout_RDX == (secp256k1_gej *)0x0) {
    psVar11 = (secp256k1_gej *)0xffffffffffffffff;
  }
  else {
    do {
      psStack_2e0 = (secp256k1_gej *)0x14d897;
      secp256k1_gej_verify(psVar15);
      psVar20 = (secp256k1_gej *)&psVar20[-1].field_0x97;
      psVar15 = psVar15 + 1;
    } while (psVar20 != (secp256k1_gej *)0x0);
    psVar26 = &a_00->z;
    psVar11 = (secp256k1_gej *)0xffffffffffffffff;
    psVar17 = (secp256k1_gej *)0x0;
    psVar15 = extraout_RDX;
    unaff_R13 = a_02;
    do {
      if ((int)psVar26[1].n[0] == 0) {
        if (psVar11 == (secp256k1_gej *)0xffffffffffffffff) {
          uVar5 = psVar26->n[0];
          uVar6 = psVar26->n[1];
          uVar7 = psVar26->n[2];
          uVar4 = psVar26->n[3];
          iVar8 = psVar26->magnitude;
          iVar3 = psVar26->normalized;
          (unaff_R13->x).n[4] = psVar26->n[4];
          (unaff_R13->x).magnitude = iVar8;
          (unaff_R13->x).normalized = iVar3;
          (unaff_R13->x).n[2] = uVar7;
          (unaff_R13->x).n[3] = uVar4;
          (unaff_R13->x).n[0] = uVar5;
          (unaff_R13->x).n[1] = uVar6;
          psVar11 = psVar17;
        }
        else {
          psStack_2e0 = (secp256k1_gej *)0x14d8e7;
          secp256k1_fe_mul(&unaff_R13->x,(secp256k1_fe *)((long)&a_02->x + (long)psVar11 * 0x68),
                           psVar26);
          psVar11 = psVar17;
        }
      }
      else {
        psStack_2e0 = (secp256k1_gej *)0x14d8c6;
        secp256k1_ge_set_infinity((secp256k1_ge *)unaff_R13);
        psVar15 = psStack_2d8;
      }
      psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1);
      unaff_R13 = (secp256k1_gej *)((unaff_R13->z).n + 1);
      psVar26 = (secp256k1_fe *)(psVar26[3].n + 1);
    } while (psVar15 != psVar17);
  }
  if (psVar11 == (secp256k1_gej *)0xffffffffffffffff) {
    return;
  }
  psVar26 = (secp256k1_fe *)((long)psVar11 * 0x68);
  psVar15 = (secp256k1_gej *)((long)psVar26 + (long)&a_02->x);
  psVar20 = (secp256k1_gej *)auStack_2d0;
  psStack_2e0 = (secp256k1_gej *)0x14d947;
  secp256k1_fe_inv_var((secp256k1_fe *)psVar20,(secp256k1_fe *)psVar15);
  psVar16 = psStack_2d8;
  if (psVar11 != (secp256k1_gej *)0x0) {
    psVar17 = (secp256k1_gej *)&psVar11[-1].field_0x97;
    unaff_R13 = (secp256k1_gej *)&a_00[(long)&psVar11[-1].field_0x97].infinity;
    psVar26 = (secp256k1_fe *)((long)(a_02->x).n + (long)psVar26 + -0x68);
    do {
      if ((int)(unaff_R13->x).n[0] == 0) {
        psStack_2e0 = (secp256k1_gej *)0x14d98b;
        secp256k1_fe_mul((secp256k1_fe *)((long)&a_02->x + (long)psVar11 * 0x68),psVar26,
                         (secp256k1_fe *)auStack_2d0);
        psVar16 = psStack_2d8;
        psVar15 = (secp256k1_gej *)auStack_2d0;
        psStack_2e0 = (secp256k1_gej *)0x14d9ab;
        psVar20 = psVar15;
        secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar15,&a_00[(long)psVar11].z);
        psVar11 = psVar17;
      }
      unaff_R13 = unaff_R13 + -1;
      psVar26 = (secp256k1_fe *)&psVar26[-3].magnitude;
      bVar29 = psVar17 != (secp256k1_gej *)0x0;
      psVar17 = (secp256k1_gej *)&psVar17[-1].field_0x97;
    } while (bVar29);
  }
  if (a_00[(long)psVar11].infinity == 0) {
    lVar12 = (long)psVar11 * 0x68;
    puVar1 = (uint64_t *)((long)&a_02->y + lVar12 + -0x10);
    *puVar1 = auStack_2d0._32_8_;
    puVar1[1] = auStack_2d0._40_8_;
    puVar1 = (uint64_t *)((long)&a_02->x + lVar12 + 0x10);
    *puVar1 = auStack_2d0._16_8_;
    puVar1[1] = auStack_2d0._24_8_;
    puVar1 = (uint64_t *)((long)&a_02->x + lVar12);
    *puVar1 = auStack_2d0._0_8_;
    puVar1[1] = auStack_2d0._8_8_;
    psVar11 = a_02;
    psVar17 = psVar16;
    if (psVar16 == (secp256k1_gej *)0x0) {
      return;
    }
    do {
      if (a_00->infinity == 0) {
        psStack_2e0 = (secp256k1_gej *)0x14da1e;
        secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar11,a_00,&psVar11->x);
      }
      a_00 = a_00 + 1;
      psVar15 = psVar17 + -1;
      psVar11 = (secp256k1_gej *)((psVar11->z).n + 1);
      psVar17 = (secp256k1_gej *)&psVar15->field_0x97;
    } while (&psVar15->field_0x97 != (undefined1 *)0x0);
    do {
      psStack_2e0 = (secp256k1_gej *)0x14da36;
      secp256k1_ge_verify((secp256k1_ge *)a_02);
      a_02 = (secp256k1_gej *)((a_02->z).n + 1);
      psVar16 = (secp256k1_gej *)&psVar16[-1].field_0x97;
    } while (psVar16 != (secp256k1_gej *)0x0);
    return;
  }
  psStack_2e0 = (secp256k1_gej *)test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  psVar16 = &sStack_3a0;
  psVar21 = &sStack_3a0;
  psStack_3a8 = (secp256k1_fe *)0x14da7d;
  piStack_300 = (int *)psVar26;
  psStack_2f8 = unaff_R13;
  psStack_2f0 = a_02;
  psStack_2e8 = a_00;
  psStack_2e0 = psVar17;
  memcpy(&sStack_3a0,psVar20,0x98);
  psStack_3a8 = (secp256k1_fe *)0x14da85;
  secp256k1_gej_verify(&sStack_3a0);
  psStack_3a8 = (secp256k1_fe *)0x14da8d;
  secp256k1_gej_verify(psVar15);
  psStack_3a8 = (secp256k1_fe *)0x14da9a;
  secp256k1_fe_cmov(&sStack_3a0.x,&psVar15->x,0);
  psVar26 = &psVar15->y;
  psStack_3a8 = (secp256k1_fe *)0x14daad;
  secp256k1_fe_cmov(&sStack_3a0.y,psVar26,0);
  r = &sStack_3a0.z;
  psVar28 = &psVar15->z;
  psStack_3a8 = (secp256k1_fe *)0x14dac3;
  secp256k1_fe_cmov(r,psVar28,0);
  psStack_3a8 = (secp256k1_fe *)0x14dacb;
  secp256k1_gej_verify(&sStack_3a0);
  psStack_3a8 = (secp256k1_fe *)0x14dad6;
  psVar11 = psVar20;
  iVar8 = gej_xyz_equals_gej(&sStack_3a0,psVar20);
  if (iVar8 == 0) {
    psStack_3a8 = (secp256k1_fe *)0x14db6d;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_3a8 = (secp256k1_fe *)0x14dae9;
    secp256k1_gej_verify(&sStack_3a0);
    psStack_3a8 = (secp256k1_fe *)0x14daf1;
    secp256k1_gej_verify(psVar15);
    psStack_3a8 = (secp256k1_fe *)0x14db01;
    secp256k1_fe_cmov(&sStack_3a0.x,&psVar15->x,1);
    psStack_3a8 = (secp256k1_fe *)0x14db13;
    secp256k1_fe_cmov(&sStack_3a0.y,psVar26,1);
    psStack_3a8 = (secp256k1_fe *)0x14db23;
    secp256k1_fe_cmov(r,psVar28,1);
    sStack_3a0.infinity = sStack_3a0.infinity & 0xfffffffeU | psVar15->infinity & 1U;
    psStack_3a8 = (secp256k1_fe *)0x14db47;
    secp256k1_gej_verify(&sStack_3a0);
    psStack_3a8 = (secp256k1_fe *)0x14db52;
    psVar11 = psVar15;
    iVar8 = gej_xyz_equals_gej(&sStack_3a0,psVar15);
    psVar16 = psVar21;
    if (iVar8 != 0) {
      return;
    }
  }
  psStack_3a8 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_3a8 = psVar28;
  psStack_3b0 = psVar26;
  puStack_3b8 = (undefined1 *)&sStack_3a0;
  psStack_3c0 = r;
  psStack_3c8 = psVar20;
  psStack_3d0 = psVar15;
  if ((*(int *)((long)psVar16 + 0x90) != psVar11->infinity) || (*(int *)((long)psVar16 + 0x90) != 0)
     ) {
    return;
  }
  psVar26 = (secp256k1_fe *)(sStack_4a0.y.n + 1);
  psStack_510 = (secp256k1_ge *)0x14dbbf;
  memcpy(psVar26,psVar16,0x98);
  psVar18 = (secp256k1_ge *)auStack_500;
  psStack_510 = (secp256k1_ge *)0x14dbd4;
  memcpy(psVar18,psVar11,0x98);
  psStack_510 = (secp256k1_ge *)0x14dbdc;
  secp256k1_fe_normalize(psVar26);
  psVar28 = &sStack_438;
  psStack_510 = (secp256k1_ge *)0x14dbec;
  secp256k1_fe_normalize(psVar28);
  psStack_510 = (secp256k1_ge *)0x14dbfc;
  secp256k1_fe_normalize(&sStack_408);
  psStack_510 = (secp256k1_ge *)0x14dc04;
  secp256k1_fe_normalize((secp256k1_fe *)psVar18);
  psVar23 = (secp256k1_ge *)(auStack_500 + 0x30);
  psStack_510 = (secp256k1_ge *)0x14dc11;
  secp256k1_fe_normalize((secp256k1_fe *)psVar23);
  psStack_510 = (secp256k1_ge *)0x14dc1e;
  secp256k1_fe_normalize(&sStack_4a0.x);
  psStack_510 = (secp256k1_ge *)0x14dc26;
  secp256k1_fe_verify(psVar26);
  psStack_510 = (secp256k1_ge *)0x14dc2e;
  a_01 = psVar18;
  secp256k1_fe_verify((secp256k1_fe *)psVar18);
  if (sStack_4a0._100_4_ == 0) {
    psStack_510 = (secp256k1_ge *)0x14dd33;
    gej_xyz_equals_gej_cold_6();
LAB_0014dd33:
    psStack_510 = (secp256k1_ge *)0x14dd38;
    gej_xyz_equals_gej_cold_5();
LAB_0014dd38:
    psStack_510 = (secp256k1_ge *)0x14dd3d;
    gej_xyz_equals_gej_cold_4();
LAB_0014dd3d:
    psStack_510 = (secp256k1_ge *)0x14dd42;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (auStack_500._44_4_ == 0) goto LAB_0014dd33;
    uVar9 = 4;
    do {
      uVar22 = *(ulong *)(auStack_500 + (ulong)uVar9 * 8);
      uVar14 = sStack_4a0.y.n[(ulong)uVar9 + 1];
      if (uVar14 >= uVar22 && uVar14 != uVar22) {
        psVar18 = (secp256k1_ge *)0x1;
        goto LAB_0014dc70;
      }
      if (uVar14 < uVar22) {
        psVar18 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014dc70;
      }
      bVar29 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar29);
    psVar18 = (secp256k1_ge *)0x0;
LAB_0014dc70:
    psStack_510 = (secp256k1_ge *)0x14dc78;
    secp256k1_fe_verify(psVar28);
    psStack_510 = (secp256k1_ge *)0x14dc80;
    a_01 = psVar23;
    secp256k1_fe_verify((secp256k1_fe *)psVar23);
    if (sStack_438.normalized == 0) goto LAB_0014dd38;
    if (iStack_4a4 == 0) goto LAB_0014dd3d;
    uVar9 = 4;
    do {
      uVar22 = *(ulong *)(auStack_500 + (ulong)uVar9 * 8 + 0x30);
      uVar14 = sStack_438.n[uVar9];
      if (uVar14 >= uVar22 && uVar14 != uVar22) {
        psVar28 = (secp256k1_fe *)0x1;
        goto LAB_0014dcc9;
      }
      if (uVar14 < uVar22) {
        psVar28 = (secp256k1_fe *)0xffffffff;
        goto LAB_0014dcc9;
      }
      bVar29 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar29);
    psVar28 = (secp256k1_fe *)0x0;
LAB_0014dcc9:
    psStack_510 = (secp256k1_ge *)0x14dcd1;
    secp256k1_fe_verify(&sStack_408);
    psStack_510 = (secp256k1_ge *)0x14dcd9;
    a_01 = &sStack_4a0;
    secp256k1_fe_verify(&sStack_4a0.x);
    if (sStack_408.normalized != 0) {
      if (sStack_4a0.x.normalized != 0) {
        uVar9 = 4;
        do {
          if (sStack_408.n[uVar9] != sStack_4a0.x.n[uVar9]) {
            return;
          }
          bVar29 = uVar9 != 0;
          uVar9 = uVar9 - 1;
        } while (bVar29);
        return;
      }
      goto LAB_0014dd47;
    }
  }
  psStack_510 = (secp256k1_ge *)0x14dd47;
  gej_xyz_equals_gej_cold_2();
LAB_0014dd47:
  psStack_510 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_00 = &sStack_6b0;
  psStack_728 = a_01;
  psStack_538 = &sStack_408;
  psStack_530 = psVar23;
  psStack_528 = psVar26;
  psStack_520 = &sStack_4a0;
  psStack_518 = psVar28;
  psStack_510 = psVar18;
  secp256k1_ge_from_storage(r_00,(secp256k1_ge_storage *)a_01);
  iVar8 = secp256k1_ge_is_valid_var(r_00);
  if (iVar8 != 0) {
    secp256k1_gej_set_ge(&sStack_5d0,&sStack_6b0);
    secp256k1_gej_double_var(&sStack_5d0,&sStack_5d0,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_720,&sStack_5d0);
    sStack_790._96_8_ = 0x40;
    while( true ) {
      psVar23 = (secp256k1_ge *)(auStack_720 + 0x30);
      secp256k1_fe_verify(&sStack_6b0.x);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_6b0.x,1);
      auStack_7f0._0_8_ = 0x3ffffbfffff0bc - sStack_6b0.x.n[0];
      auStack_7f0._8_8_ = 0x3ffffffffffffc - sStack_6b0.x.n[1];
      auStack_7f0._16_8_ = 0x3ffffffffffffc - sStack_6b0.x.n[2];
      auStack_7f0._24_8_ = 0x3ffffffffffffc - sStack_6b0.x.n[3];
      auStack_7f0._32_8_ = 0x3fffffffffffc - sStack_6b0.x.n[4];
      auStack_7f0._40_4_ = 2;
      auStack_7f0._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      r_00 = (secp256k1_ge *)auStack_720;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < (int)(auStack_720._40_4_ + auStack_7f0._40_4_)) break;
      auStack_7f0._0_8_ = auStack_7f0._0_8_ + auStack_720._0_8_;
      auStack_7f0._8_8_ = auStack_7f0._8_8_ + auStack_720._8_8_;
      auStack_7f0._16_8_ = auStack_7f0._16_8_ + auStack_720._16_8_;
      auStack_7f0._24_8_ = auStack_7f0._24_8_ + auStack_720._24_8_;
      auStack_7f0._32_8_ = auStack_7f0._32_8_ + auStack_720._32_8_;
      auStack_7f0._44_4_ = 0;
      auStack_7f0._40_4_ = auStack_720._40_4_ + auStack_7f0._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      auStack_7f0._0_8_ = ((ulong)auStack_7f0._32_8_ >> 0x30) * 0x1000003d1 + auStack_7f0._0_8_;
      auStack_7f0._8_8_ = ((ulong)auStack_7f0._0_8_ >> 0x34) + auStack_7f0._8_8_;
      auStack_7f0._16_8_ = ((ulong)auStack_7f0._8_8_ >> 0x34) + auStack_7f0._16_8_;
      uVar22 = ((ulong)auStack_7f0._16_8_ >> 0x34) + auStack_7f0._24_8_;
      auStack_7f0._24_8_ = uVar22 & 0xfffffffffffff;
      auStack_7f0._32_8_ = (uVar22 >> 0x34) + (auStack_7f0._32_8_ & 0xffffffffffff);
      auStack_7f0._16_8_ = auStack_7f0._16_8_ & 0xfffffffffffff;
      auStack_7f0._8_8_ = auStack_7f0._8_8_ & 0xfffffffffffff;
      auStack_7f0._0_8_ = auStack_7f0._0_8_ & 0xfffffffffffff;
      auStack_7f0._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      secp256k1_fe_verify(&sStack_6b0.y);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_6b0.y,1);
      auStack_7f0._48_8_ = 0x3ffffbfffff0bc - sStack_6b0.y.n[0];
      uStack_7b8 = 0x3ffffffffffffc - sStack_6b0.y.n[1];
      uStack_7b0 = 0x3ffffffffffffc - sStack_6b0.y.n[2];
      uStack_7a8 = 0x3ffffffffffffc - sStack_6b0.y.n[3];
      uStack_7a0 = 0x3fffffffffffc - sStack_6b0.y.n[4];
      uStack_798._0_4_ = 2;
      uStack_798._4_4_ = 0;
      psVar26 = (secp256k1_fe *)(auStack_7f0 + 0x30);
      secp256k1_fe_verify(psVar26);
      secp256k1_fe_verify(psVar26);
      secp256k1_fe_verify((secp256k1_fe *)psVar23);
      r_00 = psVar23;
      if (0x20 < iStack_6c8 + (int)uStack_798) goto LAB_0014e60e;
      auStack_7f0._48_8_ = auStack_7f0._48_8_ + auStack_720._48_8_;
      uStack_7b8 = uStack_7b8 + uStack_6e8;
      uStack_7b0 = uStack_7b0 + uStack_6e0;
      uStack_7a8 = uStack_7a8 + uStack_6d8;
      uStack_7a0 = uStack_7a0 + uStack_6d0;
      uStack_798 = (ulong)(uint)(iStack_6c8 + (int)uStack_798);
      secp256k1_fe_verify(psVar26);
      secp256k1_fe_verify(psVar26);
      auStack_7f0._48_8_ = (uStack_7a0 >> 0x30) * 0x1000003d1 + auStack_7f0._48_8_;
      uStack_7b8 = ((ulong)auStack_7f0._48_8_ >> 0x34) + uStack_7b8;
      uStack_7b0 = (uStack_7b8 >> 0x34) + uStack_7b0;
      uVar22 = (uStack_7b0 >> 0x34) + uStack_7a8;
      uStack_7a8 = uVar22 & 0xfffffffffffff;
      uStack_7a0 = (uVar22 >> 0x34) + (uStack_7a0 & 0xffffffffffff);
      uStack_7b0 = uStack_7b0 & 0xfffffffffffff;
      uStack_7b8 = uStack_7b8 & 0xfffffffffffff;
      auStack_7f0._48_8_ = auStack_7f0._48_8_ & 0xfffffffffffff;
      uStack_798 = CONCAT44(uStack_798._4_4_,1);
      secp256k1_fe_verify(psVar26);
      secp256k1_fe_verify((secp256k1_fe *)auStack_7f0);
      uVar22 = ((ulong)auStack_7f0._32_8_ >> 0x30) * 0x1000003d1 + auStack_7f0._0_8_;
      if (((uVar22 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar22 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar22 >> 0x34) + auStack_7f0._8_8_;
        uVar19 = (uVar14 >> 0x34) + auStack_7f0._16_8_;
        uVar24 = (uVar19 >> 0x34) + auStack_7f0._24_8_;
        uVar25 = (uVar24 >> 0x34) + (auStack_7f0._32_8_ & 0xffffffffffff);
        if ((((uVar14 | uVar22 | uVar19 | uVar24) & 0xfffffffffffff) != 0 || uVar25 != 0) &&
           ((uVar22 + 0x1000003d0 & uVar14 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e212;
        secp256k1_fe_verify(psVar26);
        uVar22 = (uStack_7a0 >> 0x30) * 0x1000003d1 + auStack_7f0._48_8_;
        if (((uVar22 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar22 & 0xfffffffffffff) != 0))
        goto LAB_0014e212;
        uVar14 = (uVar22 >> 0x34) + uStack_7b8;
        a_01 = (secp256k1_ge *)((uVar14 >> 0x34) + uStack_7b0);
        r_00 = (secp256k1_ge *)(((ulong)a_01 >> 0x34) + uStack_7a8);
        uVar19 = ((ulong)r_00 >> 0x34) + (uStack_7a0 & 0xffffffffffff);
        if ((((uVar14 | uVar22 | (ulong)a_01 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar19 != 0)
           && ((uVar22 + 0x1000003d0 & uVar14 & (ulong)a_01 & (ulong)r_00 &
               (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e212;
        goto LAB_0014e62c;
      }
LAB_0014e212:
      psVar18 = (secp256k1_ge *)((long)(psStack_728->x).n + sStack_790._96_8_);
      secp256k1_ge_from_storage(&sStack_640,(secp256k1_ge_storage *)psVar18);
      r_00 = &sStack_640;
      iVar8 = secp256k1_ge_is_valid_var(&sStack_640);
      if (iVar8 == 0) goto LAB_0014e613;
      secp256k1_fe_verify(&sStack_640.x);
      psVar18 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&sStack_640.x,1);
      sStack_790.y.n[0] = 0x3ffffbfffff0bc - sStack_640.x.n[0];
      sStack_790.y.n[1] = 0x3ffffffffffffc - sStack_640.x.n[1];
      sStack_790.y.n[2] = 0x3ffffffffffffc - sStack_640.x.n[2];
      sStack_790.y.n[3] = 0x3ffffffffffffc - sStack_640.x.n[3];
      sStack_790.y.n[4] = 0x3fffffffffffc - sStack_640.x.n[4];
      sStack_790.y.magnitude = 2;
      sStack_790.y.normalized = 0;
      psVar26 = &sStack_790.y;
      secp256k1_fe_verify(psVar26);
      secp256k1_fe_verify(psVar26);
      r_00 = (secp256k1_ge *)auStack_720;
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < auStack_720._40_4_ + sStack_790.y.magnitude) goto LAB_0014e618;
      sStack_790.y.n[0] = sStack_790.y.n[0] + auStack_720._0_8_;
      sStack_790.y.n[1] = sStack_790.y.n[1] + auStack_720._8_8_;
      sStack_790.y.n[2] = sStack_790.y.n[2] + auStack_720._16_8_;
      sStack_790.y.n[3] = sStack_790.y.n[3] + auStack_720._24_8_;
      sStack_790.y.n[4] = sStack_790.y.n[4] + auStack_720._32_8_;
      sStack_790.y.normalized = 0;
      sStack_790.y.magnitude = auStack_720._40_4_ + sStack_790.y.magnitude;
      secp256k1_fe_verify(psVar26);
      sStack_790.x.n[4] = sStack_640.y.n[4];
      sStack_790.x.magnitude = sStack_640.y.magnitude;
      sStack_790.x.normalized = sStack_640.y.normalized;
      sStack_790.x.n[2] = sStack_640.y.n[2];
      sStack_790.x.n[3] = sStack_640.y.n[3];
      sStack_790.x.n[0] = sStack_640.y.n[0];
      sStack_790.x.n[1] = sStack_640.y.n[1];
      secp256k1_fe_verify(&sStack_790.x);
      r_00 = (secp256k1_ge *)(auStack_720 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)r_00);
      if (0x20 < iStack_6c8 + sStack_790.x.magnitude) goto LAB_0014e61d;
      sStack_790.x.n[0] = sStack_790.x.n[0] + auStack_720._48_8_;
      sStack_790.x.n[1] = sStack_790.x.n[1] + uStack_6e8;
      sStack_790.x.n[2] = sStack_790.x.n[2] + uStack_6e0;
      sStack_790.x.n[3] = sStack_790.x.n[3] + uStack_6d8;
      sStack_790.x.n[4] = sStack_790.x.n[4] + uStack_6d0;
      sStack_790.x.normalized = 0;
      sStack_790.x.magnitude = iStack_6c8 + sStack_790.x.magnitude;
      secp256k1_fe_verify(&sStack_790.x);
      secp256k1_fe_verify(psVar26);
      uVar22 = (sStack_790.y.n[4] >> 0x30) * 0x1000003d1 + sStack_790.y.n[0];
      if (((uVar22 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar22 & 0xfffffffffffff) == 0)) {
        uVar14 = (uVar22 >> 0x34) + sStack_790.y.n[1];
        uVar19 = (uVar14 >> 0x34) + sStack_790.y.n[2];
        uVar24 = (uVar19 >> 0x34) + sStack_790.y.n[3];
        uVar25 = (uVar24 >> 0x34) + (sStack_790.y.n[4] & 0xffffffffffff);
        if ((((uVar14 | uVar22 | uVar19 | uVar24) & 0xfffffffffffff) != 0 || uVar25 != 0) &&
           ((uVar22 + 0x1000003d0 & uVar14 & uVar19 & uVar24 & (uVar25 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014e55f;
        secp256k1_fe_verify(&sStack_790.x);
        uVar22 = (sStack_790.x.n[4] >> 0x30) * 0x1000003d1 + sStack_790.x.n[0];
        if (((uVar22 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar22 & 0xfffffffffffff) != 0))
        goto LAB_0014e55f;
        uVar14 = (uVar22 >> 0x34) + sStack_790.x.n[1];
        a_01 = (secp256k1_ge *)((uVar14 >> 0x34) + sStack_790.x.n[2]);
        r_00 = (secp256k1_ge *)(((ulong)a_01 >> 0x34) + sStack_790.x.n[3]);
        uVar19 = ((ulong)r_00 >> 0x34) + (sStack_790.x.n[4] & 0xffffffffffff);
        if ((((uVar14 | uVar22 | (ulong)a_01 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar19 != 0)
           && ((uVar22 + 0x1000003d0 & uVar14 & (ulong)a_01 & (ulong)r_00 &
               (uVar19 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014e55f;
        goto LAB_0014e631;
      }
LAB_0014e55f:
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_7f0,psVar26);
      psVar18 = (secp256k1_ge *)(auStack_7f0 + 0x30);
      if ((iVar8 != 0) &&
         (a_01 = &sStack_790, r_00 = psVar18,
         iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar18,&sStack_790.x), iVar8 != 0))
      goto LAB_0014e627;
      secp256k1_fe_mul((secp256k1_fe *)auStack_7f0,(secp256k1_fe *)auStack_7f0,&sStack_790.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar18,(secp256k1_fe *)psVar18,&sStack_790.y);
      r_00 = (secp256k1_ge *)auStack_7f0;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_7f0,(secp256k1_fe *)psVar18);
      if (iVar8 == 0) goto LAB_0014e622;
      psVar18 = &sStack_640;
      psVar23 = &sStack_6b0;
      for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
        (psVar23->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar30 * -2 + 1) * 8);
        psVar23 = (secp256k1_ge *)((long)psVar23 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      sStack_790._96_8_ = sStack_790._96_8_ + 0x40;
      if (sStack_790._96_8_ == 0x80000) {
        return;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014e60e:
    test_pre_g_table_cold_8();
LAB_0014e613:
    test_pre_g_table_cold_7();
LAB_0014e618:
    test_pre_g_table_cold_6();
LAB_0014e61d:
    test_pre_g_table_cold_5();
LAB_0014e622:
    test_pre_g_table_cold_4();
    a_01 = psVar18;
LAB_0014e627:
    test_pre_g_table_cold_3();
LAB_0014e62c:
    test_pre_g_table_cold_1();
LAB_0014e631:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)a_01);
  auVar31._0_4_ = -(uint)((int)(a_01->x).n[2] == 0 && (int)(a_01->x).n[0] == 0);
  auVar31._4_4_ =
       -(uint)(*(int *)((long)(a_01->x).n + 0x14) == 0 && *(int *)((long)(a_01->x).n + 4) == 0);
  auVar31._8_4_ = -(uint)((int)(a_01->x).n[3] == 0 && (int)(a_01->x).n[1] == 0);
  auVar31._12_4_ =
       -(uint)(*(int *)((long)(a_01->x).n + 0x1c) == 0 && *(int *)((long)(a_01->x).n + 0xc) == 0);
  iVar8 = movmskps(extraout_EAX,auVar31);
  if (iVar8 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)count)) {
      memset(r_00,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)a_01);
    uVar7 = (a_01->x).n[0];
    uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_01,0,count);
    *(uint32_t *)(r_00->x).n = uVar10 + (~(uint)uVar7 & 1);
    iVar8 = (int)(0x7f / (long)(int)count);
    uVar9 = iVar8 * count;
    uVar27 = 0x80 - uVar9;
    uVar22 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar8) {
      lVar12 = 0;
      uVar14 = uVar22;
      do {
        uVar13 = count;
        if (lVar12 == 0) {
          uVar13 = uVar27;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_01,uVar9,uVar13);
        if (uVar10 != 0) goto LAB_0014e710;
        *(undefined4 *)((long)(r_00->x).n + uVar14 * 4) = 0;
        uVar9 = uVar9 - count;
        lVar12 = lVar12 + 1;
        bVar29 = 1 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar29);
      uVar14 = 0;
LAB_0014e710:
      iVar8 = (int)uVar14;
    }
    if (0 < iVar8) {
      uVar14 = 1;
      uVar9 = count;
      do {
        uVar13 = count;
        if (uVar22 == uVar14) {
          uVar13 = uVar27;
        }
        uVar10 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)a_01,uVar9,uVar13);
        if ((uVar10 & 1) == 0) {
          piVar2 = (int *)((long)(r_00->x).n + uVar14 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar10 = uVar10 | 1;
        }
        *(uint32_t *)((long)(r_00->x).n + uVar14 * 4) = uVar10;
        if ((1 < uVar14) &&
           (((iVar3 = *(int *)((long)(r_00->x).n + uVar14 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(r_00->x).n + uVar14 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(r_00->x).n + uVar14 * 4 + -8))))))) {
          piVar2 = (int *)((long)(r_00->x).n + uVar14 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(r_00->x).n + uVar14 * 4 + -4) = 0;
        }
        uVar14 = uVar14 + 1;
        uVar9 = uVar9 + count;
      } while (iVar8 + 1 != uVar14);
    }
  }
  return;
}

Assistant:

static void testutil_random_fe_non_zero_test(secp256k1_fe *fe) {
    do {
        testutil_random_fe_test(fe);
    } while(secp256k1_fe_is_zero(fe));
}